

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void gen_spr_power8_ebb(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if ((((env->spr_cb[800].name == (char *)0x0) && (env->spr[800] == 0)) &&
      (env->spr_cb[800].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[800].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[800].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[800].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[800].name = "BESCRS";
    env->spr_cb[800].uea_read = spr_read_ebb;
    env->spr_cb[800].uea_write = spr_write_ebb;
    env->spr_cb[800].oea_read = spr_read_generic;
    env->spr_cb[800].oea_write = spr_write_generic;
    env->spr_cb[800].hea_read = spr_read_generic;
    env->spr_cb[800].hea_write = spr_write_generic;
    env->spr_cb[800].default_value = 0;
    env->spr[800] = 0;
    if (((env->spr_cb[0x321].name == (char *)0x0) && (env->spr[0x321] == 0)) &&
       ((env->spr_cb[0x321].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x321].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x321].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x321].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x321].name = "BESCRSU";
      env->spr_cb[0x321].uea_read = spr_read_ebb_upper32;
      env->spr_cb[0x321].uea_write = spr_write_ebb_upper32;
      env->spr_cb[0x321].oea_read = spr_read_prev_upper32;
      env->spr_cb[0x321].oea_write = spr_write_prev_upper32;
      env->spr_cb[0x321].hea_read = spr_read_prev_upper32;
      env->spr_cb[0x321].hea_write = spr_write_prev_upper32;
      env->spr_cb[0x321].default_value = 0;
      env->spr[0x321] = 0;
      if (((env->spr_cb[0x322].name == (char *)0x0) && (env->spr[0x322] == 0)) &&
         (((env->spr_cb[0x322].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x322].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x322].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
          (env->spr_cb[0x322].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        env->spr_cb[0x322].name = "BESCRR";
        env->spr_cb[0x322].uea_read = spr_read_ebb;
        env->spr_cb[0x322].uea_write = spr_write_ebb;
        env->spr_cb[0x322].oea_read = spr_read_generic;
        env->spr_cb[0x322].oea_write = spr_write_generic;
        env->spr_cb[0x322].hea_read = spr_read_generic;
        env->spr_cb[0x322].hea_write = spr_write_generic;
        env->spr_cb[0x322].default_value = 0;
        env->spr[0x322] = 0;
        if (((((env->spr_cb[0x323].name == (char *)0x0) && (env->spr[0x323] == 0)) &&
             (env->spr_cb[0x323].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            ((env->spr_cb[0x323].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x323].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
           (env->spr_cb[0x323].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
          env->spr_cb[0x323].name = "BESCRRU";
          env->spr_cb[0x323].uea_read = spr_read_ebb_upper32;
          env->spr_cb[0x323].uea_write = spr_write_ebb_upper32;
          env->spr_cb[0x323].oea_read = spr_read_prev_upper32;
          env->spr_cb[0x323].oea_write = spr_write_prev_upper32;
          env->spr_cb[0x323].hea_read = spr_read_prev_upper32;
          env->spr_cb[0x323].hea_write = spr_write_prev_upper32;
          env->spr_cb[0x323].default_value = 0;
          env->spr[0x323] = 0;
          if (((env->spr_cb[0x324].name == (char *)0x0) && (env->spr[0x324] == 0)) &&
             ((env->spr_cb[0x324].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
              (((env->spr_cb[0x324].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                (env->spr_cb[0x324].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
               (env->spr_cb[0x324].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
            env->spr_cb[0x324].name = "EBBHR";
            env->spr_cb[0x324].uea_read = spr_read_ebb;
            env->spr_cb[0x324].uea_write = spr_write_ebb;
            env->spr_cb[0x324].oea_read = spr_read_generic;
            env->spr_cb[0x324].oea_write = spr_write_generic;
            env->spr_cb[0x324].hea_read = spr_read_generic;
            env->spr_cb[0x324].hea_write = spr_write_generic;
            env->spr_cb[0x324].default_value = 0;
            env->spr[0x324] = 0;
            if ((((env->spr_cb[0x325].name == (char *)0x0) && (env->spr[0x325] == 0)) &&
                ((env->spr_cb[0x325].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                 ((env->spr_cb[0x325].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                  (env->spr_cb[0x325].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))))))
               && (env->spr_cb[0x325].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
              env->spr_cb[0x325].name = "EBBRR";
              env->spr_cb[0x325].uea_read = spr_read_ebb;
              env->spr_cb[0x325].uea_write = spr_write_ebb;
              env->spr_cb[0x325].oea_read = spr_read_generic;
              env->spr_cb[0x325].oea_write = spr_write_generic;
              env->spr_cb[0x325].hea_read = spr_read_generic;
              env->spr_cb[0x325].hea_write = spr_write_generic;
              env->spr_cb[0x325].default_value = 0;
              env->spr[0x325] = 0;
              if ((((env->spr_cb[0x326].name == (char *)0x0) && (env->spr[0x326] == 0)) &&
                  (env->spr_cb[0x326].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                 (((env->spr_cb[0x326].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                   (env->spr_cb[0x326].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                  (env->spr_cb[0x326].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                env->spr_cb[0x326].name = "BESCR";
                env->spr_cb[0x326].uea_read = spr_read_ebb;
                env->spr_cb[0x326].uea_write = spr_write_ebb;
                env->spr_cb[0x326].oea_read = spr_read_generic;
                env->spr_cb[0x326].oea_write = spr_write_generic;
                env->spr_cb[0x326].hea_read = spr_read_generic;
                env->spr_cb[0x326].hea_write = spr_write_generic;
                env->spr_cb[0x326].default_value = 0;
                env->spr[0x326] = 0;
                return;
              }
              uVar2 = 0x326;
              uVar1 = 0x326;
            }
            else {
              uVar2 = 0x325;
              uVar1 = 0x325;
            }
          }
          else {
            uVar2 = 0x324;
            uVar1 = 0x324;
          }
        }
        else {
          uVar2 = 0x323;
          uVar1 = 0x323;
        }
      }
      else {
        uVar2 = 0x322;
        uVar1 = 0x322;
      }
    }
    else {
      uVar2 = 0x321;
      uVar1 = 0x321;
    }
  }
  else {
    uVar2 = 800;
    uVar1 = 800;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static inline void _spr_register(CPUPPCState *env, int num,
                                 const char *name,
                                 void (*uea_read)(DisasContext *ctx,
                                                  int gprn, int sprn),
                                 void (*uea_write)(DisasContext *ctx,
                                                   int sprn, int gprn),
                                 void (*oea_read)(DisasContext *ctx,
                                                  int gprn, int sprn),
                                 void (*oea_write)(DisasContext *ctx,
                                                   int sprn, int gprn),
                                 void (*hea_read)(DisasContext *opaque,
                                                  int gprn, int sprn),
                                 void (*hea_write)(DisasContext *opaque,
                                                   int sprn, int gprn),
#if defined(CONFIG_KVM)
                                 uint64_t one_reg_id,
#endif
                                 target_ulong initial_value)
{
    ppc_spr_t *spr;

    spr = &env->spr_cb[num];
    if (spr->name != NULL || env->spr[num] != 0x00000000 ||
        spr->oea_read != NULL || spr->oea_write != NULL ||
        spr->uea_read != NULL || spr->uea_write != NULL) {
        printf("Error: Trying to register SPR %d (%03x) twice !\n", num, num);
        exit(1);
    }
#if defined(PPC_DEBUG_SPR)
    printf("*** register spr %d (%03x) %s val " TARGET_FMT_lx "\n", num, num,
           name, initial_value);
#endif
    spr->name = name;
    spr->uea_read = uea_read;
    spr->uea_write = uea_write;
    spr->oea_read = oea_read;
    spr->oea_write = oea_write;
    spr->hea_read = hea_read;
    spr->hea_write = hea_write;
#if defined(CONFIG_KVM)
    spr->one_reg_id = one_reg_id,
#endif
    env->spr[num] = spr->default_value = initial_value;
}